

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TValue * newkey(lua_State *L,Table *t,TValue *key)

{
  uint uVar1;
  global_State *pgVar2;
  uint uVar3;
  Value VVar4;
  undefined8 uVar5;
  TValue *pTVar6;
  undefined4 uVar7;
  int lg;
  uint uVar8;
  Node *pNVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *pNVar12;
  long lVar13;
  long lVar14;
  TKey *pTVar15;
  TValue *pTVar16;
  int ttlg;
  uint uVar17;
  ulong uVar18;
  int ause;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  int *nums;
  Node *pNVar26;
  int iVar27;
  bool bVar28;
  int local_cc;
  int local_b8 [34];
  
  pNVar9 = mainposition(t,key);
  if ((pNVar9 == &dummynode_) || (pNVar26 = pNVar9, (pNVar9->i_val).tt != 0)) {
    pNVar11 = t->node;
    pNVar26 = t->lastfree;
    while( true ) {
      pNVar10 = pNVar26;
      pNVar26 = pNVar10 + -1;
      t->lastfree = pNVar26;
      if (pNVar10 <= pNVar11) break;
      if (pNVar10[-1].i_key.nk.tt == 0) goto code_r0x0010747e;
    }
    for (lVar13 = 0; lVar13 != 0x1f; lVar13 = lVar13 + 1) {
      local_b8[lVar13] = 0;
    }
    iVar27 = 1;
    iVar19 = 0;
    lVar13 = 1;
    for (lVar14 = 0; lVar14 != 0x1f; lVar14 = lVar14 + 1) {
      iVar25 = t->sizearray;
      iVar22 = iVar27;
      if ((iVar25 < iVar27) && (iVar22 = iVar25, iVar25 < (int)lVar13)) break;
      lVar21 = (long)(int)lVar13;
      lVar13 = (long)iVar22 + 1;
      if ((long)iVar22 + 1 <= lVar21) {
        lVar13 = lVar21;
      }
      lVar23 = lVar13 - lVar21;
      lVar21 = lVar21 * 0x10 + -8;
      iVar25 = 0;
      while (bVar28 = lVar23 != 0, lVar23 = lVar23 + -1, bVar28) {
        iVar25 = (iVar25 + 1) - (uint)(*(int *)((long)&t->array->value + lVar21) == 0);
        lVar21 = lVar21 + 0x10;
      }
      local_b8[lVar14] = local_b8[lVar14] + iVar25;
      iVar19 = iVar19 + iVar25;
      iVar27 = iVar27 * 2;
    }
    lVar13 = (0x100000000 << (t->lsizenode & 0x3f)) >> 0x20;
    iVar27 = 0;
    nums = local_b8;
    local_cc = 0;
    do {
      lVar14 = -lVar13;
      pTVar15 = &pNVar11[lVar13].i_key;
      do {
        lVar14 = lVar14 + 1;
        if (lVar14 == 1) {
          iVar25 = countint(key,nums);
          uVar8 = iVar25 + iVar27 + iVar19;
          uVar20 = 0;
          uVar24 = 1;
          uVar17 = 0;
          uVar18 = 0;
          goto LAB_001075d5;
        }
        pTVar6 = &pTVar15->tvk + -3;
        pTVar16 = &pTVar15->tvk + -3;
        pTVar15 = (TKey *)&pTVar6->tt;
      } while ((pTVar16->value).b == 0);
      iVar25 = countint((TValue *)&pTVar6->tt,nums);
      iVar27 = iVar27 + iVar25;
      local_cc = local_cc + 1;
      lVar13 = -lVar14;
    } while( true );
  }
LAB_0010765a:
  (pNVar26->i_key).nk.value = key->value;
  iVar27 = key->tt;
  (pNVar26->i_key).nk.tt = iVar27;
  if (((3 < iVar27) && (((((key->value).gc)->gch).marked & 3) != 0)) && ((t->marked & 4) != 0)) {
    pgVar2 = L->l_G;
    t->marked = t->marked & 0xfb;
    t->gclist = pgVar2->grayagain;
    pgVar2->grayagain = (GCObject *)t;
  }
  return &pNVar26->i_val;
LAB_001075d5:
  iVar27 = (int)uVar18;
  uVar3 = (uint)(uVar24 >> 1);
  if (uVar8 <= uVar3) {
LAB_00107610:
    resize(L,t,iVar27,((iVar19 + local_cc) - uVar17) + 1);
    pTVar16 = luaH_set(L,t,key);
    return pTVar16;
  }
  iVar27 = *nums;
  uVar1 = iVar27 + uVar20;
  if (0 < iVar27) {
    uVar20 = uVar1;
  }
  if (0 < iVar27 && (int)uVar3 < (int)uVar1) {
    uVar18 = uVar24;
    uVar17 = uVar1;
  }
  iVar27 = (int)uVar18;
  if (uVar20 == uVar8) goto LAB_00107610;
  uVar24 = (ulong)(uint)((int)uVar24 * 2);
  nums = nums + 1;
  goto LAB_001075d5;
code_r0x0010747e:
  pNVar11 = mainposition(t,&(pNVar9->i_key).tvk);
  if (pNVar11 == pNVar9) {
    pNVar10[-1].i_key.nk.next = (pNVar9->i_key).nk.next;
    (pNVar9->i_key).nk.next = pNVar26;
  }
  else {
    do {
      pNVar12 = pNVar11;
      pNVar11 = (pNVar12->i_key).nk.next;
    } while (pNVar11 != pNVar9);
    (pNVar12->i_key).nk.next = pNVar26;
    pNVar10[-1].i_key.nk.next = (pNVar9->i_key).nk.next;
    VVar4 = (pNVar9->i_val).value;
    iVar27 = (pNVar9->i_val).tt;
    uVar7 = *(undefined4 *)&(pNVar9->i_val).field_0xc;
    uVar5 = *(undefined8 *)((long)&pNVar9->i_key + 8);
    pNVar10[-1].i_key.nk.value = (pNVar9->i_key).nk.value;
    *(undefined8 *)((long)&pNVar10[-1].i_key + 8) = uVar5;
    (pNVar26->i_val).value = VVar4;
    pNVar10[-1].i_val.tt = iVar27;
    *(undefined4 *)&pNVar10[-1].i_val.field_0xc = uVar7;
    (pNVar9->i_key).nk.next = (Node *)0x0;
    (pNVar9->i_val).tt = 0;
    pNVar26 = pNVar9;
  }
  goto LAB_0010765a;
}

Assistant:

static TValue*newkey(lua_State*L,Table*t,const TValue*key){
Node*mp=mainposition(t,key);
if(!ttisnil(gval(mp))||mp==(&dummynode_)){
Node*othern;
Node*n=getfreepos(t);
if(n==NULL){
rehash(L,t,key);
return luaH_set(L,t,key);
}
othern=mainposition(t,key2tval(mp));
if(othern!=mp){
while(gnext(othern)!=mp)othern=gnext(othern);
gnext(othern)=n;
*n=*mp;
gnext(mp)=NULL;
setnilvalue(gval(mp));
}
else{
gnext(n)=gnext(mp);
gnext(mp)=n;
mp=n;
}
}
gkey(mp)->value=key->value;gkey(mp)->tt=key->tt;
luaC_barriert(L,t,key);
return gval(mp);
}